

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::
format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_arg_id(format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *this,int id)

{
  undefined8 uVar1;
  int in_ECX;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_68;
  type local_58 [6];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if ((this->parse_context).next_arg_id_ < 1) {
    (this->parse_context).next_arg_id_ = -1;
    internal::
    get_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
              ((format_arg *)&local_68.string,(internal *)&this->context,
               (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                *)(ulong)(uint)id,in_ECX);
    (this->arg).type_ = local_58[0];
    (this->arg).value_.field_0.long_long_value = local_68.long_long_value;
    (this->arg).value_.field_0.string.size = local_68.string.size;
    return;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cannot switch from automatic to manual argument indexing","");
  local_68.pointer = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_40,local_40 + local_38);
  uVar1 = duckdb_fmt::v6::internal::error_handler::on_error(&this->parse_context,&local_68);
  if (local_68._0_8_ != local_58) {
    operator_delete(local_68.pointer);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void on_arg_id(int id) {
    parse_context.check_arg_id(id);
    get_arg(id);
  }